

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase466::run(TestCase466 *this)

{
  uint *puVar1;
  _func_int **pp_Var2;
  PromiseNode *pPVar3;
  __pid_t _Var4;
  TransformPromiseNodeBase *pTVar5;
  ForkHubBase *this_00;
  Refcounted *refcounted;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:480:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:476:40),_kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>
  branch1;
  Promise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> promise;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_a8;
  Own<kj::_::PromiseNode> local_98;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  EventLoop *local_68;
  undefined4 local_60;
  __pid_t local_54;
  EventLoop local_50;
  
  EventLoop::EventLoop(&local_50);
  local_60 = 0xffffffff;
  local_68 = &local_50;
  EventLoop::enterScope(&local_50);
  _::yield();
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_98,
             _::
             TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:470:51),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar3 = local_98.ptr;
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00435568;
  local_78.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::_::Void,kj::(anonymous_namespace)::TestCase466::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_78.ptr = (PromiseNode *)pTVar5;
  if (local_98.ptr != (PromiseNode *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    (**(local_98.disposer)->_vptr_Disposer)
              (local_98.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  this_00 = (ForkHubBase *)operator_new(0x1d0);
  (this_00->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00435630;
  (this_00->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00435668;
  _::ForkHubBase::ForkHubBase(this_00,&local_78,(ExceptionOrValue *)(this_00 + 1));
  (this_00->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00435630;
  (this_00->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_00435668;
  *(undefined1 *)&this_00[1].super_Refcounted.super_Disposer._vptr_Disposer = 0;
  this_00[4].inner.ptr = (PromiseNode *)0x0;
  this_00[4].resultRef = (ExceptionOrValue *)0x0;
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&local_a8);
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_a8,
             _::
             TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:476:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar3 = local_a8.ptr;
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00435720;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_98.ptr = (PromiseNode *)pTVar5;
  if (local_a8.ptr != (PromiseNode *)0x0) {
    local_a8.ptr = (PromiseNode *)0x0;
    (**(local_a8.disposer)->_vptr_Disposer)
              (local_a8.disposer,
               (_func_int *)((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2])
              );
  }
  ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_>::addBranch
            ((ForkedPromise<kj::Own<kj::(anonymous_namespace)::RefcountedInt>_> *)&local_88);
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_88,
             _::
             TransformPromiseNode<int,_kj::Own<kj::(anonymous_namespace)::RefcountedInt>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:480:40),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar3 = local_88.ptr;
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004357a8;
  local_a8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::Own<kj::(anonymous_namespace)::RefcountedInt>,kj::(anonymous_namespace)::TestCase466::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_a8.ptr = (PromiseNode *)pTVar5;
  if (local_88.ptr != (PromiseNode *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_88.disposer._4_4_,local_88.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_88.disposer._4_4_,local_88.disposer._0_4_),
               pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  pp_Var2 = (this_00->super_Refcounted).super_Disposer._vptr_Disposer;
  (**pp_Var2)(this_00,pp_Var2[-2] + (long)&(this_00->super_Refcounted).super_Disposer._vptr_Disposer
             );
  _Var4 = Promise<int>::wait((Promise<int> *)&local_98,&local_68);
  if ((_Var4 != 0x1c8) && (_::Debug::minSeverity < 3)) {
    local_88.disposer._0_4_ = 0x1c8;
    local_54 = Promise<int>::wait((Promise<int> *)&local_98,&local_68);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1e9,ERROR,
               "\"failed: expected \" \"(456) == (branch1.wait(waitScope))\", 456, branch1.wait(waitScope)"
               ,(char (*) [52])"failed: expected (456) == (branch1.wait(waitScope))",
               (int *)&local_88,&local_54);
  }
  _Var4 = Promise<int>::wait((Promise<int> *)&local_a8,&local_68);
  if ((_Var4 != 0x315) && (_::Debug::minSeverity < 3)) {
    local_88.disposer._0_4_ = 0x315;
    local_54 = Promise<int>::wait((Promise<int> *)&local_a8,&local_68);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(789) == (branch2.wait(waitScope))\", 789, branch2.wait(waitScope)"
               ,(char (*) [52])"failed: expected (789) == (branch2.wait(waitScope))",
               (int *)&local_88,&local_54);
  }
  pPVar3 = local_a8.ptr;
  if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_a8.ptr = (PromiseNode *)0x0;
    (**(local_a8.disposer)->_vptr_Disposer)
              (local_a8.disposer,
               ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  pPVar3 = local_98.ptr;
  if ((TransformPromiseNodeBase *)local_98.ptr != (TransformPromiseNodeBase *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    (**(local_98.disposer)->_vptr_Disposer)
              (local_98.disposer,
               ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  pPVar3 = local_78.ptr;
  if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (**(local_78.disposer)->_vptr_Disposer)
              (local_78.disposer,
               ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_68);
  EventLoop::~EventLoop(&local_50);
  return;
}

Assistant:

TEST(Async, ForkRef) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<Own<RefcountedInt>> promise = evalLater([&]() {
    return refcounted<RefcountedInt>(123);
  });

  auto fork = promise.fork();

  auto branch1 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 456;
  });
  auto branch2 = fork.addBranch().then([](Own<RefcountedInt>&& i) {
    EXPECT_EQ(123, i->i);
    return 789;
  });

  {
    auto releaseFork = kj::mv(fork);
  }

  EXPECT_EQ(456, branch1.wait(waitScope));
  EXPECT_EQ(789, branch2.wait(waitScope));
}